

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

QSize __thiscall QMdiSubWindow::minimumSizeHint(QMdiSubWindow *this)

{
  QMdiSubWindowPrivate *this_00;
  QWidgetData *pQVar1;
  QObject *pQVar2;
  Data *pDVar3;
  QWidget *this_01;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  QMdiSubWindowPrivate *pQVar8;
  QLayout *pQVar9;
  ulong uVar10;
  QStyle *pQVar11;
  QProxyStyle *this_02;
  long lVar12;
  uint uVar13;
  QSize QVar14;
  uint uVar15;
  long in_FS_OFFSET;
  int minWidth;
  int margin;
  uint local_40;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
  pQVar8 = this_00;
  if ((((this->super_QWidget).data)->widget_attributes & 0x8000) != 0) {
    QWidget::ensurePolished(&this->super_QWidget);
    pQVar8 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
  }
  if (*(long *)&(pQVar8->super_QWidgetPrivate).field_0x10 != 0) {
    bVar4 = QWidget::isMinimized(&this->super_QWidget);
    if ((bVar4) && (*(char *)(*(long *)&(this->super_QWidget).field_0x8 + 0x2d4) == '\0')) {
      QVar14 = QMdiSubWindowPrivate::iconSize(this_00);
      uVar10 = (ulong)QVar14 >> 0x20;
      goto LAB_004528be;
    }
  }
  local_3c = -0x55555556;
  local_40 = 0xaaaaaaaa;
  QMdiSubWindowPrivate::sizeParameters(this_00,&local_3c,(int *)&local_40);
  iVar7 = local_3c;
  iVar5 = QMdiSubWindowPrivate::titleBarHeight(this_00);
  lVar12 = *(long *)&(this->super_QWidget).field_0x8;
  if ((*(long *)(lVar12 + 0x10) != 0) && (*(char *)(lVar12 + 0x2d4) == '\x01')) {
    pQVar1 = (this->super_QWidget).data;
    uVar13 = ((pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i) + 1;
    if ((int)uVar13 < (int)local_40) {
      uVar13 = local_40;
    }
    QVar14.ht.m_i = 0;
    QVar14.wd.m_i = uVar13;
    uVar13 = QMdiSubWindowPrivate::titleBarHeight(this_00);
    uVar10 = (ulong)uVar13;
    goto LAB_004528be;
  }
  uVar15 = iVar5 + iVar7;
  pQVar9 = QWidget::layout(&this->super_QWidget);
  uVar13 = uVar15;
  if (pQVar9 == (QLayout *)0x0) {
    pDVar3 = (this_00->baseWidget).wp.d;
    if ((((pDVar3 != (Data *)0x0) && (*(int *)(pDVar3 + 4) != 0)) &&
        (pQVar2 = (this_00->baseWidget).wp.value, pQVar2 != (QObject *)0x0)) &&
       ((*(byte *)(*(long *)(pQVar2 + 0x20) + 9) & 0x80) != 0)) {
      uVar10 = (**(code **)(*(long *)pQVar2 + 0x78))();
      goto LAB_00452751;
    }
  }
  else {
    pQVar9 = QWidget::layout(&this->super_QWidget);
    uVar10 = (**(code **)(*(long *)pQVar9 + 0x90))(pQVar9);
LAB_00452751:
    if ((uVar10 & 0x8000000080000000) == 0) {
      uVar6 = (int)uVar10 + iVar7 * 2;
      if ((int)uVar6 < (int)local_40) {
        uVar6 = local_40;
      }
      uVar13 = (int)(uVar10 >> 0x20) + uVar15;
      local_40 = uVar6;
    }
  }
  pDVar3 = (this_00->sizeGrip).wp.d;
  if (((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) ||
     (this_01 = (QWidget *)(this_00->sizeGrip).wp.value, this_01 == (QWidget *)0x0)) {
LAB_0045280f:
    iVar7 = 0;
    if (*(long *)(*(long *)&(this->super_QWidget).field_0x8 + 0x10) != 0) {
      pQVar11 = QWidget::style(&this->super_QWidget);
      this_02 = (QProxyStyle *)QMetaObject::cast((QObject *)&QProxyStyle::staticMetaObject);
      if (this_02 != (QProxyStyle *)0x0) {
        pQVar11 = QProxyStyle::baseStyle(this_02);
      }
      lVar12 = (**(code **)(*(long *)pQVar11 + 8))(pQVar11,"QMacStyle");
      iVar7 = 0;
      if ((lVar12 != 0) &&
         (((pDVar3 = (this_00->sizeGrip).wp.d, pDVar3 == (Data *)0x0 || (*(int *)(pDVar3 + 4) == 0))
          || ((this_00->sizeGrip).wp.value == (QObject *)0x0)))) {
        pQVar11 = QWidget::style(&this->super_QWidget);
        iVar7 = (**(code **)(*(long *)pQVar11 + 0xe0))(pQVar11,0x45,0,this);
      }
    }
  }
  else {
    bVar4 = QWidget::isVisibleTo(this_01,&this->super_QWidget);
    if (!bVar4) goto LAB_0045280f;
    lVar12 = *(long *)((this_00->sizeGrip).wp.value + 0x20);
    iVar7 = (*(int *)(lVar12 + 0x20) - *(int *)(lVar12 + 0x18)) + 1;
  }
  uVar6 = iVar7 + uVar15;
  if ((int)(iVar7 + uVar15) < (int)uVar13) {
    uVar6 = uVar13;
  }
  uVar10 = (ulong)uVar6;
  QVar14.ht.m_i = 0;
  QVar14.wd.m_i = local_40;
LAB_004528be:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QSize)((ulong)QVar14 & 0xffffffff | uVar10 << 0x20);
  }
  __stack_chk_fail();
}

Assistant:

QSize QMdiSubWindow::minimumSizeHint() const
{
    Q_D(const QMdiSubWindow);
    if (isVisible())
        ensurePolished();

    // Minimized window.
    if (parent() && isMinimized() && !isShaded())
        return d->iconSize();

    // Calculate window decoration.
    int margin, minWidth;
    d->sizeParameters(&margin, &minWidth);
    int decorationHeight = margin + d->titleBarHeight();
    int minHeight = decorationHeight;

    // Shaded window.
    if (parent() && isShaded())
        return QSize(qMax(minWidth, width()), d->titleBarHeight());

    // Content
    if (layout()) {
        QSize minLayoutSize = layout()->minimumSize();
        if (minLayoutSize.isValid()) {
            minWidth = qMax(minWidth, minLayoutSize.width() + 2 * margin);
            minHeight += minLayoutSize.height();
        }
    } else if (d->baseWidget && d->baseWidget->isVisible()) {
        QSize minBaseWidgetSize = d->baseWidget->minimumSizeHint();
        if (minBaseWidgetSize.isValid()) {
            minWidth = qMax(minWidth, minBaseWidgetSize.width() + 2 * margin);
            minHeight += minBaseWidgetSize.height();
        }
    }

#if QT_CONFIG(sizegrip)
    // SizeGrip
    int sizeGripHeight = 0;
    if (d->sizeGrip && d->sizeGrip->isVisibleTo(const_cast<QMdiSubWindow *>(this)))
        sizeGripHeight = d->sizeGrip->height();
    else if (parent() && isMacStyle(style()) && !d->sizeGrip)
        sizeGripHeight = style()->pixelMetric(QStyle::PM_SizeGripSize, nullptr, this);
    minHeight = qMax(minHeight, decorationHeight + sizeGripHeight);
#endif

    return QSize(minWidth, minHeight);
}